

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  string text;
  string line;
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  RegularExpression *local_58;
  string local_50;
  
  if (this->OutputLinePending == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->OS,"\n",1);
    this->OutputLinePending = false;
  }
  if (!inlineMarkup) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->OS,(line_in->_M_dataplus)._M_p,line_in->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    return;
  }
  ReplaceSubstitutions(&local_50,this,line_in);
  local_58 = &this->CMakeRole;
  pcVar6 = (char *)0x0;
  do {
    bVar2 = cmsys::RegularExpression::find(local_58,local_50._M_dataplus._M_p + (long)pcVar6);
    poVar5 = this->OS;
    if (!bVar2) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_50);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b8,local_b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b8,local_b0);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    pcVar1 = (this->CMakeRole).startp[3];
    local_b8 = &local_a8;
    if (pcVar1 == (char *)0x0) {
      local_b0 = 0;
      local_a8 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,pcVar1,(this->CMakeRole).endp[3]);
    }
    pcVar1 = (this->CMakeRole).startp[2];
    if (pcVar1 == (char *)0x0) {
      local_98 = &local_88;
      local_90 = 0;
      local_88 = 0;
    }
    else {
      local_98 = &local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pcVar1,(this->CMakeRole).endp[2]);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar3 == 0) {
      pcVar1 = (this->CMakeRole).startp[5];
      if (pcVar1 == (char *)0x0) {
        local_78 = &local_68;
        local_70 = 0;
        local_68 = 0;
LAB_0037e2bf:
        lVar4 = std::__cxx11::string::find_first_of((char *)&local_b8,0x6406a2,0);
        bVar2 = lVar4 == -1;
      }
      else {
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar1,(this->CMakeRole).endp[5]);
        if (local_70 == 0) goto LAB_0037e2bf;
        bVar2 = false;
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if (bVar2) {
      std::__cxx11::string::append((char *)&local_b8);
    }
    poVar5 = this->OS;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b8,local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
    pcVar6 = (this->CMakeRole).endp[0] + ((long)pcVar6 - (long)(this->CMakeRole).searchstring);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
  } while( true );
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    while (this->CMakeRole.find(line.c_str() + pos)) {
      this->OS << line.substr(pos, this->CMakeRole.start());
      std::string text = this->CMakeRole.match(3);
      // If a command reference has no explicit target and
      // no explicit "(...)" then add "()" to the text.
      if (this->CMakeRole.match(2) == "command" &&
          this->CMakeRole.match(5).empty() &&
          text.find_first_of("()") == std::string::npos) {
        text += "()";
      }
      this->OS << "``" << text << "``";
      pos += this->CMakeRole.end();
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}